

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall QScrollerPrivate::setState(QScrollerPrivate *this,State newstate)

{
  bool bVar1;
  parameter_type t;
  State in_ESI;
  QScrollerPrivate *in_RDI;
  long in_FS_OFFSET;
  bool startTimer;
  bool sendLastScroll;
  QScroller *q;
  QScrollEvent se;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff18;
  State _t1;
  QScrollerPrivate *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff30;
  byte bVar2;
  byte bVar3;
  QScrollerPrivate *this_00;
  QPointF local_c0;
  QPointF local_b0;
  qreal local_a0;
  char *in_stack_ffffffffffffff68;
  QDebug local_70;
  QDebug local_68;
  QScroller *local_60;
  State local_54;
  QScrollEvent local_50 [56];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_54 = in_ESI;
  local_60 = q_func(in_RDI);
  bVar3 = 0;
  bVar2 = 0;
  if (in_RDI->state != local_54) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcScroller();
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa817bb);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff30)),
                 (char *)in_RDI,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                 (char *)in_stack_ffffffffffffff18,(char *)0xa817d1);
      QMessageLogger::debug();
      ::operator<<((QDebug *)&local_68,(QObject *)&local_70);
      in_stack_ffffffffffffff20 =
           (QScrollerPrivate *)QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff68);
      stateName(local_54);
      QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff68);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff20,
                         (char)((ulong)in_stack_ffffffffffffff18 >> 0x38));
      QDebug::~QDebug(&local_68);
      QDebug::~QDebug(&local_70);
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    t = (parameter_type)(ulong)local_54;
    switch(t) {
    case (parameter_type)0x0:
      QAbstractAnimation::stop();
      if ((in_RDI->firstScroll & 1U) == 0) {
        bVar3 = 1;
      }
      QPointF::QPointF((QPointF *)&local_a0,0.0,0.0);
      (in_RDI->releaseVelocity).xp = local_a0;
      (in_RDI->releaseVelocity).yp = (qreal)in_stack_ffffffffffffff68;
      break;
    case (parameter_type)0x1:
      QAbstractAnimation::stop();
      (in_RDI->oldVelocity).xp = (in_RDI->releaseVelocity).xp;
      (in_RDI->oldVelocity).yp = (in_RDI->releaseVelocity).yp;
      QPointF::QPointF(&local_b0,0.0,0.0);
      (in_RDI->releaseVelocity).xp = local_b0.xp;
      (in_RDI->releaseVelocity).yp = local_b0.yp;
      break;
    case (parameter_type)0x2:
      QPointF::QPointF(&local_c0,0.0,0.0);
      (in_RDI->dragDistance).xp = local_c0.xp;
      (in_RDI->dragDistance).yp = local_c0.yp;
      if (in_RDI->state == Pressed) {
        bVar2 = 1;
      }
      break;
    case (parameter_type)0x3:
      bVar2 = 1;
    }
    qSwap<QScroller::State>((State *)in_stack_ffffffffffffff20,(State *)t);
    if ((bVar2 & 1) != 0) {
      QScrollTimer::start((QScrollTimer *)in_stack_ffffffffffffff20);
    }
    if ((bVar3 & 1) != 0) {
      memcpy(local_50,&DAT_00b4bf20,0x38);
      QScrollEvent::QScrollEvent
                (local_50,(QPointF *)&in_RDI->contentPosition,(QPointF *)&in_RDI->overshootPosition,
                 ScrollFinished);
      sendEvent(in_stack_ffffffffffffff20,&t->super_QObject,(QEvent *)0xa81a09);
      in_RDI->firstScroll = true;
      QScrollEvent::~QScrollEvent(local_50);
    }
    if ((in_RDI->state == Dragging) || (in_RDI->state == Scrolling)) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>::
      operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                  *)t);
      bVar1 = QListSpecialMethodsBase<QScroller*>::contains<QScroller*>
                        ((QListSpecialMethodsBase<QScroller_*> *)in_stack_ffffffffffffff20,
                         (QScroller **)t);
      if (!bVar1) {
        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>::
        operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                    *)t);
        QList<QScroller_*>::push_back((QList<QScroller_*> *)in_stack_ffffffffffffff20,t);
      }
      _t1 = (State)((ulong)t >> 0x20);
    }
    else {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>::
      operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                  *)t);
      QList<QScroller*>::removeOne<QScroller*>
                ((QList<QScroller_*> *)in_stack_ffffffffffffff20,(QScroller **)t);
      _t1 = (State)((ulong)t >> 0x20);
    }
    QScroller::stateChanged((QScroller *)0xa81ab0,_t1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::setState(QScroller::State newstate)
{
    Q_Q(QScroller);
    bool sendLastScroll = false;
    bool startTimer = false;

    if (state == newstate)
        return;

    qCDebug(lcScroller) << q << "QScroller::setState(" << stateName(newstate) << ')';

    switch (newstate) {
    case QScroller::Inactive:
#if QT_CONFIG(animation)
        scrollTimer->stop();
#endif

        // send the last scroll event (but only after the current state change was finished)
        if (!firstScroll)
            sendLastScroll = true;

        releaseVelocity = QPointF(0, 0);
        break;

    case QScroller::Pressed:
#if QT_CONFIG(animation)
        scrollTimer->stop();
#endif

        oldVelocity = releaseVelocity;
        releaseVelocity = QPointF(0, 0);
        break;

    case QScroller::Dragging:
        dragDistance = QPointF(0, 0);
#if QT_CONFIG(animation)
        if (state == QScroller::Pressed)
            startTimer = true;
#endif
        break;

    case QScroller::Scrolling:
#if QT_CONFIG(animation)
        startTimer = true;
#endif
        break;
    }

    qSwap(state, newstate);

#if QT_CONFIG(animation)
    // Only start the timer after the state has been changed
    if (startTimer)
        scrollTimer->start();
#endif
    if (sendLastScroll) {
        QScrollEvent se(contentPosition, overshootPosition, QScrollEvent::ScrollFinished);
        sendEvent(target, &se);
        firstScroll = true;
    }
    if (state == QScroller::Dragging || state == QScroller::Scrolling) {
        if (!qt_activeScrollers()->contains(q))
            qt_activeScrollers()->push_back(q);
    } else {
        qt_activeScrollers()->removeOne(q);
    }
    emit q->stateChanged(state);
}